

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsTextureBufferCase.cpp
# Opt level: O2

ShaderProgram *
deqp::gls::anon_unknown_1::createRenderProgram(RenderContext *renderContext,RenderBits renderBits)

{
  ContextType type;
  GLSLVersion glslVersion;
  ShaderProgram *this;
  char *pcVar1;
  string fragmentShaderSource;
  string vertexShaderSource;
  string fragmentShaderTemplate;
  string vertexShaderTemplate;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  ostream local_190;
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<(&local_190,"${VERSION_HEADER}\n");
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    std::operator<<(&local_190,"${TEXTURE_BUFFER_EXT}");
  }
  std::operator<<(&local_190,
                  "${VTX_INPUT} layout(location = 0) ${HIGHP} vec2 i_coord;\n${VTX_OUTPUT} ${HIGHP} vec4 v_color;\n"
                 );
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) != RENDERBITS_NONE) {
    std::operator<<(&local_190,"uniform ${HIGHP} samplerBuffer u_vtxSampler;\n");
  }
  std::operator<<(&local_190,"\nvoid main (void)\n{\n");
  pcVar1 = 
  "\tv_color = texelFetch(u_vtxSampler, clamp((int(round(i_coord.x * 4.0)) + 4) * (int(round(i_coord.y * 4.0)) + 4), 0, textureSize(u_vtxSampler)-1));\n"
  ;
  if ((renderBits & RENDERBITS_AS_VERTEX_TEXTURE) == RENDERBITS_NONE) {
    pcVar1 = "\tv_color = vec4(1.0);\n";
  }
  std::operator<<(&local_190,pcVar1);
  std::operator<<(&local_190,"\tgl_Position = vec4(2.0 * (i_coord - vec2(0.5)), 0.0, 1.0);\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_190);
  std::operator<<(&local_190,"${VERSION_HEADER}\n");
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    std::operator<<(&local_190,"${TEXTURE_BUFFER_EXT}");
  }
  std::operator<<(&local_190,
                  "${FRAG_OUTPUT} layout(location = 0) ${HIGHP} vec4 dEQP_FragColor;\n${FRAG_INPUT} ${HIGHP} vec4 v_color;\n"
                 );
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) != RENDERBITS_NONE) {
    std::operator<<(&local_190,"uniform ${HIGHP} samplerBuffer u_fragSampler;\n");
  }
  std::operator<<(&local_190,"\nvoid main (void)\n{\n");
  pcVar1 = 
  "\t${HIGHP} vec4 color = 0.5 * (v_color + texelFetch(u_fragSampler, clamp(int(gl_FragCoord.x) * int(gl_FragCoord.y), 0, textureSize(u_fragSampler)-1)));\n"
  ;
  if ((renderBits & RENDERBITS_AS_FRAGMENT_TEXTURE) == RENDERBITS_NONE) {
    pcVar1 = "\t${HIGHP} vec4 color = v_color;\n";
  }
  std::operator<<(&local_190,pcVar1);
  std::operator<<(&local_190,"\tdEQP_FragColor = vec4(color.xyz * color.w, 1.0);\n}\n");
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_190);
  type.super_ApiType.m_bits = (ApiType)(*renderContext->_vptr_RenderContext[2])(renderContext);
  glslVersion = glu::getContextTypeGLSLVersion(type);
  specializeShader(&local_1f0,&local_1b0,glslVersion);
  specializeShader(&local_210,&local_1d0,glslVersion);
  this = (ShaderProgram *)operator_new(0xd0);
  glu::makeVtxFragSources((ProgramSources *)&local_190,&local_1f0,&local_210);
  glu::ShaderProgram::ShaderProgram(this,renderContext,(ProgramSources *)&local_190);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&local_190);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1b0);
  return this;
}

Assistant:

glu::ShaderProgram* createRenderProgram (glu::RenderContext&	renderContext,
										 RenderBits				renderBits)
{
	const string				vertexShaderTemplate	= generateVertexShaderTemplate(renderBits);
	const string				fragmentShaderTemplate	= generateFragmentShaderTemplate(renderBits);

	const glu::GLSLVersion		glslVersion				= glu::getContextTypeGLSLVersion(renderContext.getType());

	const string				vertexShaderSource		= specializeShader(vertexShaderTemplate, glslVersion);
	const string				fragmentShaderSource	= specializeShader(fragmentShaderTemplate, glslVersion);

	glu::ShaderProgram* const	program					= new glu::ShaderProgram(renderContext, glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	return program;
}